

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [32];
  __m256i c;
  __m256i vH;
  __m256i vH_00;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  int iVar9;
  parasail_result_t *result;
  __m256i *palVar10;
  __m256i *palVar11;
  __m256i *b;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  undefined4 in_register_00000014;
  ulong uVar15;
  char *__format;
  int iVar16;
  __m256i *ptr;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  uint d;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar25;
  undefined4 in_stack_fffffffffffffe80;
  uint seglen;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar26;
  ulong local_178;
  __m256i *local_170;
  undefined1 local_138 [32];
  undefined1 auVar24 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "profile";
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "profile->profile32.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar13 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar13 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "open";
        }
        else {
          if (-1 < gap) {
            iVar9 = ppVar4->max;
            result = parasail_result_new_table1((uint)((ulong)uVar2 + 7) & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              uVar19 = (ulong)uVar2 + 7 >> 3;
              result->flag = result->flag | 0x8420804;
              palVar10 = parasail_memalign___m256i(0x20,uVar19);
              palVar11 = parasail_memalign___m256i(0x20,uVar19);
              local_170 = parasail_memalign___m256i(0x20,uVar19);
              b = parasail_memalign___m256i(0x20,uVar19);
              local_178 = 0;
              if ((b != (__m256i *)0x0 && local_170 != (__m256i *)0x0) &&
                  (palVar11 != (__m256i *)0x0 && palVar10 != (__m256i *)0x0)) {
                alVar1[0]._4_4_ = in_register_00000014;
                alVar1[0]._0_4_ = s2Len;
                alVar1[1]._0_4_ = in_stack_fffffffffffffe70;
                alVar1[1]._4_4_ = in_stack_fffffffffffffe74;
                alVar1[2] = (longlong)result;
                alVar1[3]._0_4_ = in_stack_fffffffffffffe80;
                alVar1[3]._4_4_ = in_stack_fffffffffffffe84;
                parasail_memset___m256i(palVar10,alVar1,uVar19);
                c[0]._4_4_ = in_register_00000014;
                c[0]._0_4_ = s2Len;
                c[1]._0_4_ = in_stack_fffffffffffffe70;
                c[1]._4_4_ = in_stack_fffffffffffffe74;
                c[2] = (longlong)result;
                c[3]._0_4_ = in_stack_fffffffffffffe80;
                c[3]._4_4_ = in_stack_fffffffffffffe84;
                parasail_memset___m256i(b,c,uVar19);
                seglen = (uint)uVar19;
                uVar8 = seglen - 1;
                uVar12 = (ulong)(uint)s2Len;
                auVar23._8_4_ = 0xc0000000;
                auVar23._0_8_ = 0xc0000000c0000000;
                auVar23._12_4_ = 0xc0000000;
                auVar23._16_4_ = 0xc0000000;
                auVar23._20_4_ = 0xc0000000;
                auVar23._24_4_ = 0xc0000000;
                auVar23._28_4_ = 0xc0000000;
                auVar24 = ZEXT3264(auVar23);
                iVar25 = -0x40000000;
                uVar18 = 0;
                uVar26 = 0;
                do {
                  ptr = palVar10;
                  d = s2Len;
                  if (uVar18 == uVar12) {
LAB_0076731c:
                    if (iVar25 == 0x7fffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar9 = parasail_result_is_saturated(result);
                    palVar10 = local_170;
                    if (iVar9 == 0) {
                      if ((int)local_178 == d - 2) {
                        palVar10 = palVar11;
                      }
                      if ((int)local_178 == d - 1) {
                        palVar10 = ptr;
                        ptr = local_170;
                      }
                      iVar9 = uVar2 - 1;
                      for (uVar19 = 0; (seglen & 0xfffffff) << 3 != (uint)uVar19;
                          uVar19 = uVar19 + 1) {
                        if ((*(int *)((long)*palVar10 + uVar19 * 4) == iVar25) &&
                           (iVar16 = ((uint)uVar19 & 7) * seglen +
                                     ((uint)(uVar19 >> 3) & 0x1fffffff), iVar16 < iVar9)) {
                          iVar9 = iVar16;
                        }
                      }
                      if ((int)local_178 != d - 2) {
                        local_170 = palVar11;
                      }
                      if ((int)local_178 != d - 1) {
                        palVar11 = local_170;
                      }
                    }
                    else {
                      local_178._0_4_ = 0;
                      iVar25 = 0x7fffffff;
                      iVar9 = 0;
                    }
                    result->score = iVar25;
                    result->end_query = iVar9;
                    result->end_ref = (int)local_178;
                    parasail_free(b);
                    parasail_free(palVar10);
                    parasail_free(palVar11);
                    parasail_free(ptr);
                    return result;
                  }
                  local_138 = auVar24._0_32_;
                  alVar1 = palVar10[uVar8];
                  auVar21 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  iVar16 = ppVar4->mapper[(byte)s2[uVar18]];
                  iVar14 = (int)uVar19;
                  d = (uint)uVar18;
                  ptr = palVar11;
                  if ((int)local_178 == d - 2) {
                    ptr = local_170;
                  }
                  auVar21 = vpalignr_avx2((undefined1  [32])alVar1,auVar21,0xc);
                  auVar22 = ZEXT1664((undefined1  [16])0x0);
                  lVar17 = 0;
                  for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
                    auVar20 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])
                                                   ((long)pvVar3 +
                                                   lVar17 + (long)(iVar16 * iVar14) * 0x20));
                    auVar21 = *(undefined1 (*) [32])((long)*b + lVar17);
                    auVar5 = vpmaxsd_avx2(auVar21,auVar22._0_32_);
                    auVar20 = vpmaxsd_avx2(auVar20,auVar5);
                    auVar20 = vpmaxsd_avx2(auVar20,_DAT_008a5840);
                    *(undefined1 (*) [32])((long)*ptr + lVar17) = auVar20;
                    vH[0]._4_4_ = in_register_00000014;
                    vH[0]._0_4_ = s2Len;
                    vH[1]._0_4_ = in_stack_fffffffffffffe70;
                    vH[1]._4_4_ = iVar25;
                    vH[2] = (longlong)result;
                    vH[3]._0_4_ = seglen;
                    vH[3]._4_4_ = uVar26;
                    arr_store_si256(((result->field_4).rowcols)->score_row,vH,(int32_t)uVar15,seglen
                                    ,d,s2Len);
                    uVar19 = CONCAT44(uVar26,seglen);
                    local_138 = vpmaxsd_avx2(auVar20,local_138);
                    auVar7._4_4_ = open;
                    auVar7._0_4_ = open;
                    auVar7._8_4_ = open;
                    auVar7._12_4_ = open;
                    auVar7._16_4_ = open;
                    auVar7._20_4_ = open;
                    auVar7._24_4_ = open;
                    auVar7._28_4_ = open;
                    auVar20 = vpsubd_avx2(auVar20,auVar7);
                    auVar5._4_4_ = gap;
                    auVar5._0_4_ = gap;
                    auVar5._8_4_ = gap;
                    auVar5._12_4_ = gap;
                    auVar5._16_4_ = gap;
                    auVar5._20_4_ = gap;
                    auVar5._24_4_ = gap;
                    auVar5._28_4_ = gap;
                    auVar21 = vpsubd_avx2(auVar21,auVar5);
                    auVar21 = vpmaxsd_avx2(auVar21,auVar20);
                    *(undefined1 (*) [32])((long)*b + lVar17) = auVar21;
                    auVar21 = vpsubd_avx2(auVar22._0_32_,auVar5);
                    auVar21 = vpmaxsd_avx2(auVar21,auVar20);
                    auVar22 = ZEXT3264(auVar21);
                    auVar21 = *(undefined1 (*) [32])((long)*palVar10 + lVar17);
                    lVar17 = lVar17 + 0x20;
                  }
                  if ((int)local_178 == d - 2) {
                    local_170 = palVar11;
                  }
                  auVar24 = ZEXT3264(local_138);
                  for (iVar16 = 0; iVar16 != 8; iVar16 = iVar16 + 1) {
                    auVar20 = auVar22._0_32_;
                    auVar21 = vperm2i128_avx2(auVar20,auVar20,0x28);
                    auVar21 = vpalignr_avx2(auVar20,auVar21,0xc);
                    uVar15 = 0;
                    palVar11 = ptr;
                    while (auVar22 = ZEXT3264(auVar21), uVar19 != uVar15) {
                      alVar1 = (__m256i)vpmaxsd_avx2(auVar21,(undefined1  [32])*palVar11);
                      *palVar11 = alVar1;
                      vH_00[0]._4_4_ = in_register_00000014;
                      vH_00[0]._0_4_ = s2Len;
                      vH_00[1]._0_4_ = in_stack_fffffffffffffe70;
                      vH_00[1]._4_4_ = iVar25;
                      vH_00[2] = (longlong)result;
                      vH_00[3]._0_4_ = seglen;
                      vH_00[3]._4_4_ = uVar26;
                      arr_store_si256(((result->field_4).rowcols)->score_row,vH_00,(int32_t)uVar15,
                                      (int32_t)uVar19,d,s2Len);
                      auVar20 = vpmaxsd_avx2((undefined1  [32])alVar1,auVar24._0_32_);
                      auVar24 = ZEXT3264(auVar20);
                      auVar20._4_4_ = open;
                      auVar20._0_4_ = open;
                      auVar20._8_4_ = open;
                      auVar20._12_4_ = open;
                      auVar20._16_4_ = open;
                      auVar20._20_4_ = open;
                      auVar20._24_4_ = open;
                      auVar20._28_4_ = open;
                      auVar20 = vpsubd_avx2((undefined1  [32])alVar1,auVar20);
                      auVar6._4_4_ = gap;
                      auVar6._0_4_ = gap;
                      auVar6._8_4_ = gap;
                      auVar6._12_4_ = gap;
                      auVar6._16_4_ = gap;
                      auVar6._20_4_ = gap;
                      auVar6._24_4_ = gap;
                      auVar6._28_4_ = gap;
                      auVar21 = vpsubd_avx2(auVar21,auVar6);
                      auVar20 = vpcmpgtd_avx2(auVar21,auVar20);
                      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar20 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar20 >> 0x7f,0) == '\0') &&
                            (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar20 >> 0xbf,0) == '\0') &&
                          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar20[0x1f]) {
                        uVar19 = CONCAT44(uVar26,seglen);
                        goto LAB_007672a3;
                      }
                      uVar15 = uVar15 + 1;
                      palVar11 = palVar11 + 1;
                      uVar19 = CONCAT44(uVar26,seglen);
                    }
                  }
LAB_007672a3:
                  auVar20 = auVar24._0_32_;
                  auVar21 = vpcmpgtd_avx2(auVar20,auVar23);
                  palVar11 = palVar10;
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar21 >> 0x7f,0) != '\0') ||
                        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar21 >> 0xbf,0) != '\0') ||
                      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar21[0x1f] < '\0') {
                    auVar23 = vpermq_avx2(auVar20,0x44);
                    auVar23 = vpmaxsd_avx2(auVar20,auVar23);
                    auVar21 = vpslldq_avx2(auVar23,8);
                    auVar23 = vpmaxsd_avx2(auVar23,auVar21);
                    auVar21 = vpslldq_avx2(auVar23,4);
                    auVar23 = vpmaxsd_avx2(auVar23,auVar21);
                    iVar25 = auVar23._28_4_;
                    if (0x7ffffffe - iVar9 < iVar25) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      goto LAB_0076731c;
                    }
                    auVar21._8_4_ = 7;
                    auVar21._0_8_ = 0x700000007;
                    auVar21._12_4_ = 7;
                    auVar21._16_4_ = 7;
                    auVar21._20_4_ = 7;
                    auVar21._24_4_ = 7;
                    auVar21._28_4_ = 7;
                    auVar23 = vpermd_avx2(auVar21,auVar23);
                    local_178 = uVar18 & 0xffffffff;
                  }
                  uVar18 = uVar18 + 1;
                  palVar10 = ptr;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_avx2_256_32",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}